

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool __thiscall ghc::filesystem::path::has_relative_path(path *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  size_type rootPathLen;
  path *in_stack_ffffffffffffffe8;
  path *in_stack_fffffffffffffff0;
  
  sVar2 = root_name_length(in_stack_ffffffffffffffe8);
  bVar1 = has_root_directory(in_stack_fffffffffffffff0);
  uVar3 = sVar2 + (long)(int)(uint)bVar1;
  uVar4 = std::__cxx11::string::length();
  return uVar3 < uVar4;
}

Assistant:

GHC_INLINE bool path::has_relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return rootPathLen < _path.length();
}